

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O1

void __thiscall ApprovalTests::DiffInfo::DiffInfo(DiffInfo *this,string *program_,Type type_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->program).field_2;
  (this->program)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (program_->_M_dataplus)._M_p;
  paVar2 = &program_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&program_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->program).field_2 + 8) = uVar4;
  }
  else {
    (this->program)._M_dataplus._M_p = pcVar3;
    (this->program).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->program)._M_string_length = program_->_M_string_length;
  (program_->_M_dataplus)._M_p = (pointer)paVar2;
  program_->_M_string_length = 0;
  (program_->field_2)._M_local_buf[0] = '\0';
  getDefaultArguments_abi_cxx11_();
  this->type = type_;
  return;
}

Assistant:

DiffInfo::DiffInfo(std::string program_, Type type_)
        : program(std::move(program_)), arguments(getDefaultArguments()), type(type_)
    {
    }